

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O0

client * workspace_find_window_client(workspace *workspace,xcb_window_t window)

{
  client *pcVar1;
  client *client;
  node *node;
  xcb_window_t window_local;
  workspace *workspace_local;
  
  client = (client *)workspace->clients->head;
  while( true ) {
    if (client == (client *)0x0) {
      return (client *)0x0;
    }
    pcVar1 = get_client_from_client_node((node *)client);
    if ((pcVar1 != (client *)0x0) && (pcVar1->window == window)) break;
    client = *(client **)client;
  }
  return pcVar1;
}

Assistant:

struct client *workspace_find_window_client(const struct workspace *workspace, xcb_window_t window)
{
        LIST_FOR_EACH(workspace->clients, node)
        {
                struct client *client = get_client_from_client_node(node);

                if (client == NULL) {
                        continue;
                }

                if (client->window == window) {
                        return client;
                }
        }

        return NULL;
}